

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O1

int pmain(lua_State *L)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int status;
  lua_Integer lVar5;
  char **argv;
  long lVar6;
  char *pcVar7;
  int argc;
  uint uVar8;
  int script;
  char *pcVar9;
  uint idx;
  ulong n;
  bool bVar10;
  
  uVar8 = 0;
  script = 1;
  lVar5 = lua_tointegerx(L,1,(int *)0x0);
  argv = (char **)lua_touserdata(L,2);
  pcVar7 = argv[1];
  if (pcVar7 != (char *)0x0) {
    uVar8 = 0;
    script = 1;
    do {
      if (*pcVar7 != '-') break;
      bVar1 = pcVar7[1];
      if (bVar1 < 0x69) {
        if (bVar1 < 0x65) {
          if (bVar1 == 0x45) {
            if (pcVar7[2] == '\0') {
              uVar8 = uVar8 | 0x10;
              goto LAB_00108bef;
            }
          }
          else {
            if (bVar1 == 0) break;
            if (bVar1 == 0x2d) {
              uVar3 = 1;
              if (pcVar7[2] == '\0') {
                uVar3 = uVar8;
              }
              uVar8 = uVar3;
              script = script + (uint)(pcVar7[2] == '\0');
              break;
            }
          }
        }
        else if (bVar1 == 0x65) {
          uVar8 = uVar8 | 8;
          goto LAB_00108bc7;
        }
LAB_00108c20:
        uVar8 = 1;
        break;
      }
      if (bVar1 == 0x69) {
        uVar8 = uVar8 | 2;
LAB_00108be6:
        if (pcVar7[2] != '\0') goto LAB_00108c20;
        uVar8 = uVar8 | 4;
      }
      else {
        if (bVar1 != 0x6c) {
          if (bVar1 != 0x76) goto LAB_00108c20;
          goto LAB_00108be6;
        }
LAB_00108bc7:
        if (pcVar7[2] == '\0') {
          if ((argv[(long)script + 1] == (char *)0x0) || (*argv[(long)script + 1] == '-'))
          goto LAB_00108c20;
          script = script + 1;
        }
      }
LAB_00108bef:
      lVar6 = (long)script;
      script = script + 1;
      pcVar7 = argv[lVar6 + 1];
    } while (pcVar7 != (char *)0x0);
  }
  luaL_checkversion_(L,503.0,0x88);
  pcVar7 = *argv;
  if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
    progname = pcVar7;
  }
  if (uVar8 == 1) {
    pcVar7 = argv[script];
    ravi_writestringerror(L,"%s: ",progname);
    cVar2 = pcVar7[1];
    pcVar9 = "unrecognized option \'%s\'\n";
    if (cVar2 == 'l') {
      pcVar9 = "\'%s\' needs argument\n";
    }
    if (cVar2 == 'e') {
      pcVar9 = "\'%s\' needs argument\n";
    }
    ravi_writestringerror(L,pcVar9,pcVar7);
    ravi_writestringerror
              (L,
               "usage: %s [options] [script [args]]\nAvailable options are:\n  -e stat  execute string \'stat\'\n  -i       enter interactive mode after executing \'script\'\n  -l name  require library \'name\' into global \'name\'\n  -v       show version information\n  -E       ignore environment variables\n  --       stop handling options\n  -        stop handling options and execute stdin\n"
               ,progname);
    return 0;
  }
  if ((uVar8 & 4) != 0) {
    print_version(L);
  }
  argc = (int)lVar5;
  if ((uVar8 & 0x10) == 0) {
    luaL_openlibs(L);
    luaL_requiref(L,"T",luaB_opentests,1);
    lua_settop(L,-2);
    createargtable(L,argv,argc,script);
    pcVar7 = getenv("LUA_INIT_5_3");
    if (pcVar7 == (char *)0x0) {
      pcVar7 = getenv("LUA_INIT");
      pcVar9 = "=LUA_INIT";
    }
    else {
      pcVar9 = "=LUA_INIT_5_3";
    }
    iVar4 = 0;
    if (pcVar7 != (char *)0x0) {
      if (*pcVar7 == '@') {
        iVar4 = luaL_loadfilex(L,pcVar7 + 1,(char *)0x0);
        iVar4 = dochunk(L,iVar4);
      }
      else {
        iVar4 = dostring(L,pcVar7,pcVar9);
      }
    }
    if (iVar4 != 0) {
      return 0;
    }
  }
  else {
    lua_pushboolean(L,1);
    lua_setfield(L,-0xf4628,"LUA_NOENV");
    luaL_openlibs(L);
    luaL_requiref(L,"T",luaB_opentests,1);
    lua_settop(L,-2);
    createargtable(L,argv,argc,script);
  }
  if (1 < script) {
    iVar4 = 1;
    do {
      pcVar7 = argv[iVar4];
      if (*pcVar7 != '-') {
        __assert_fail("argv[i][0] == \'-\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lua.c"
                      ,0x20c,"int runargs(lua_State *, char **, int)");
      }
      cVar2 = pcVar7[1];
      if ((cVar2 == 'l') || (bVar10 = true, cVar2 == 'e')) {
        if (pcVar7[2] == '\0') {
          pcVar7 = argv[(long)iVar4 + 1];
          iVar4 = iVar4 + 1;
        }
        else {
          pcVar7 = pcVar7 + 2;
        }
        if (pcVar7 == (char *)0x0) {
          __assert_fail("extra != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lua.c"
                        ,0x211,"int runargs(lua_State *, char **, int)");
        }
        if (cVar2 == 'e') {
          status = dostring(L,pcVar7,"=(command line)");
        }
        else {
          lua_getglobal(L,"require");
          lua_pushstring(L,pcVar7);
          status = docall(L,1,1);
          if (status == 0) {
            lua_setglobal(L,pcVar7);
          }
          report(L,status);
        }
        bVar10 = status == 0;
      }
      if (!bVar10) {
        return 0;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < script);
  }
  if (script < argc) {
    pcVar7 = argv[script];
    iVar4 = strcmp(pcVar7,"-");
    if ((iVar4 == 0) && (iVar4 = strcmp(argv[(long)script + -1],"--"), iVar4 != 0)) {
      pcVar7 = (char *)0x0;
    }
    iVar4 = luaL_loadfilex(L,pcVar7,(char *)0x0);
    if (iVar4 == 0) {
      iVar4 = lua_getglobal(L,"arg");
      if (iVar4 != 5) {
        luaL_error(L,"\'arg\' is not a table");
      }
      idx = 0xffffffff;
      lVar5 = luaL_len(L,-1);
      uVar3 = (uint)lVar5;
      luaL_checkstack(L,uVar3 + 3,"too many arguments to script");
      if (0 < (int)uVar3) {
        n = 1;
        iVar4 = -1;
        do {
          lua_rawgeti(L,iVar4,n);
          n = n + 1;
          iVar4 = iVar4 + -1;
        } while (uVar3 + 1 != n);
        idx = ~uVar3;
      }
      lua_rotate(L,idx,-1);
      lua_settop(L,-2);
      iVar4 = docall(L,uVar3,-1);
    }
    report(L,iVar4);
    if (iVar4 != 0) {
      return 0;
    }
  }
  if ((uVar8 & 2) == 0) {
    if ((script != argc) || ((uVar8 & 0xc) != 0)) goto LAB_0010900b;
    print_version(L);
  }
  doREPL(L);
LAB_0010900b:
  lua_pushboolean(L,1);
  return 1;
}

Assistant:

static int pmain (lua_State *L) {
  int argc = (int)lua_tointeger(L, 1);
  char **argv = (char **)lua_touserdata(L, 2);
  int script;
  int args = collectargs(argv, &script);
  luaL_checkversion(L);  /* check that interpreter has correct version */
  if (argv[0] && argv[0][0]) progname = argv[0];
  if (args == has_error) {  /* bad arg? */
    print_usage(L, argv[script]);  /* 'script' has index of bad arg. */
    return 0;
  }
  if (args & has_v)  /* option '-v'? */
    print_version(L);
  if (args & has_E) {  /* option '-E'? */
    lua_pushboolean(L, 1);  /* signal for libraries to ignore env. vars. */
    lua_setfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  }
  luaL_openlibs(L);  /* open standard libraries */
  createargtable(L, argv, argc, script);  /* create table 'arg' */
  //lua_gc(L, LUA_GCGEN, 0, 0);  /* GC in generational mode */
  if (!(args & has_E)) {  /* no option '-E'? */
    if (handle_luainit(L) != LUA_OK)  /* run LUA_INIT */
      return 0;  /* error running LUA_INIT */
  }
  if (!runargs(L, argv, script))  /* execute arguments -e and -l */
    return 0;  /* something failed */
  if (script < argc &&  /* execute main script (if there is one) */
      handle_script(L, argv + script) != LUA_OK)
    return 0;
  if (args & has_i)  /* -i option? */
    doREPL(L);  /* do read-eval-print loop */
  else if (script == argc && !(args & (has_e | has_v))) {  /* no arguments? */
    if (lua_stdin_is_tty()) {  /* running in interactive mode? */
      print_version(L);
      doREPL(L);  /* do read-eval-print loop */
    }
    else dofile(L, NULL);  /* executes stdin as a file */
  }
  lua_pushboolean(L, 1);  /* signal no errors */
  return 1;
}